

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O3

void embree::parseComments(Ref<embree::Stream<embree::Token>_> *cin)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Token *pTVar3;
  runtime_error *this;
  long *plVar4;
  long *plVar5;
  string local_f8;
  Token local_d8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_d8.str.field_2;
  while( true ) {
    pTVar3 = Stream<embree::Token>::peek(cin->ptr);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"<!--","");
    Token::Sym(&local_d8,&local_f8);
    bVar2 = operator==(pTVar3,&local_d8);
    if (local_d8.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (!bVar2) break;
    while( true ) {
      Stream<embree::Token>::drop(cin->ptr);
      pTVar3 = Stream<embree::Token>::peek(cin->ptr);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-->","");
      Token::Sym(&local_d8,&local_70);
      bVar2 = operator==(pTVar3,&local_d8);
      if (local_d8.loc.fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.loc.fileName.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.str._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (bVar2) break;
      pTVar3 = Stream<embree::Token>::peek(cin->ptr);
      local_d8.loc.lineNumber._0_4_ = 0xffffffff;
      local_d8.loc.lineNumber._4_4_ = 0xffffffff;
      local_d8.loc.colNumber._0_4_ = 0xffffffff;
      local_d8.loc.colNumber._4_4_ = 0xffffffff;
      local_d8.ty = TY_EOF;
      local_d8.str._M_string_length = 0;
      local_d8.str.field_2._M_local_buf[0] = '\0';
      local_d8.loc.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_d8.loc.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8.str._M_dataplus._M_p = (pointer)paVar1;
      bVar2 = operator==(pTVar3,&local_d8);
      if (local_d8.loc.fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.loc.fileName.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.str._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.str._M_dataplus._M_p);
      }
      if (bVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        Stream<embree::Token>::get(&local_d8,cin->ptr);
        ParseLocation::str_abi_cxx11_(&local_50,&local_d8.loc);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_90 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_90 == plVar5) {
          local_80 = *plVar5;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar5;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::runtime_error::runtime_error(this,(string *)&local_90);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    Stream<embree::Token>::drop(cin->ptr);
  }
  return;
}

Assistant:

void parseComments(Ref<Stream<Token> >& cin)
  {
    while (cin->peek() == Token::Sym("<!--")) {
      cin->drop();
      while (cin->peek() != Token::Sym("-->")) {
        if (cin->peek() == Token::Eof())
          THROW_RUNTIME_ERROR(cin->get().Location().str()+": --> expected");
        cin->drop();
      }
      cin->drop();
    }
  }